

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::FuncPass::run(FuncPass *this,Zone *zone,Logger *logger)

{
  long lVar1;
  Error EVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  bool bVar3;
  Error _err;
  FuncNode *func;
  BaseNode *node;
  long local_68;
  
  lVar1 = *(long *)(in_RDI[1] + 0x1a0);
  do {
    if (lVar1 == 0) {
      return 0;
    }
    local_68 = lVar1;
    if (*(char *)(lVar1 + 0x10) == '\x10') {
      local_68 = *(long *)(lVar1 + 0x340);
      EVar2 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_RSI,in_RDX,lVar1);
      if (EVar2 != 0) {
        return EVar2;
      }
    }
    do {
      lVar1 = *(long *)(local_68 + 8);
      bVar3 = false;
      if (lVar1 != 0) {
        bVar3 = *(char *)(lVar1 + 0x10) != '\x10';
      }
      local_68 = lVar1;
    } while (bVar3);
  } while( true );
}

Assistant:

Error FuncPass::run(Zone* zone, Logger* logger) {
  BaseNode* node = cb()->firstNode();
  if (!node) return kErrorOk;

  do {
    if (node->type() == NodeType::kFunc) {
      FuncNode* func = node->as<FuncNode>();
      node = func->endNode();
      ASMJIT_PROPAGATE(runOnFunction(zone, logger, func));
    }

    // Find a function by skipping all nodes that are not `NodeType::kFunc`.
    do {
      node = node->next();
    } while (node && node->type() != NodeType::kFunc);
  } while (node);

  return kErrorOk;
}